

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::move(QWidget *this,QPoint *p)

{
  Representation *pRVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar8;
  QWExtra *pQVar9;
  int iVar10;
  int iVar11;
  QWidgetPrivate *d_2;
  QWidgetPrivate *d;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((this_00->high_attributes[0] >> 0xb & 1) == 0) {
    this_00->high_attributes[0] = this_00->high_attributes[0] | 0x800;
  }
  uVar3 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((this_00->high_attributes[0] & 0x10000000) == 0) {
    if ((uVar3 & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      puVar2 = (ushort *)
               ((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
      *puVar2 = *puVar2 | 0x100;
    }
    pQVar8 = this->data;
    iVar4 = (p->xp).m_i;
    pRVar1 = &(pQVar8->crect).x2;
    pRVar1->m_i = pRVar1->m_i + (iVar4 - (pQVar8->crect).x1.m_i);
    (pQVar8->crect).x1.m_i = iVar4;
    iVar4 = (p->yp).m_i;
    pRVar1 = &(pQVar8->crect).y2;
    pRVar1->m_i = pRVar1->m_i + (iVar4 - (pQVar8->crect).y1.m_i);
    (pQVar8->crect).y1.m_i = iVar4;
    uVar3 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((uVar3 & 4) == 0) {
      *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar3 | 4;
    }
  }
  else {
    if ((uVar3 & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      puVar2 = (ushort *)
               ((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
      *puVar2 = *puVar2 & 0xfeff;
    }
    iVar4 = (this->data->crect).x1.m_i;
    iVar5 = (p->xp).m_i;
    iVar10 = x(this);
    iVar6 = (this->data->crect).y1.m_i;
    iVar7 = (p->yp).m_i;
    iVar11 = y(this);
    pQVar8 = this->data;
    QWidgetPrivate::setGeometry_sys
              (this_00,(iVar4 + iVar5) - iVar10,(iVar6 + iVar7) - iVar11,
               ((pQVar8->crect).x2.m_i - (pQVar8->crect).x1.m_i) + 1,
               ((pQVar8->crect).y2.m_i - (pQVar8->crect).y1.m_i) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar9 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar9 != (QWExtra *)0x0) && ((pQVar9->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
    return;
  }
  return;
}

Assistant:

void QWidget::move(const QPoint &p)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Moved);
    if (testAttribute(Qt::WA_WState_Created)) {
        if (isWindow())
            d->topData()->posIncludesFrame = false;
        d->setGeometry_sys(p.x() + geometry().x() - QWidget::x(),
                       p.y() + geometry().y() - QWidget::y(),
                       width(), height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        // no frame yet: see also QWidgetPrivate::fixPosIncludesFrame(), QWindowPrivate::PositionPolicy.
        if (isWindow())
            d->topData()->posIncludesFrame = true;
        data->crect.moveTopLeft(p); // no frame yet
        setAttribute(Qt::WA_PendingMoveEvent);
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}